

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMMemoryCopyFillLowering.cpp
# Opt level: O3

void __thiscall
wasm::LLVMMemoryCopyFillLowering::createMemoryFillFunc
          (LLVMMemoryCopyFillLowering *this,Module *module)

{
  MixedArena *this_00;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var1;
  size_t sVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Binary *pBVar5;
  MemorySize *pMVar6;
  Const *pCVar7;
  Binary *this_01;
  Binary *this_02;
  If *this_03;
  Unary *this_04;
  Break *pBVar8;
  Store *this_05;
  Block *pBVar9;
  Loop *this_06;
  Function *pFVar10;
  undefined1 uVar11;
  ulong extraout_RDX;
  ulong uVar12;
  string_view sVar13;
  optional<wasm::Type> type;
  Name memoryName;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  initializer_list<wasm::Expression_*> local_c8;
  Break *local_b8;
  LocalSet *local_b0;
  Store *local_a8;
  Break *local_a0;
  LLVMMemoryCopyFillLowering *local_98;
  Module *local_90;
  Expression *local_88;
  size_t local_80;
  string_view local_78;
  string_view local_68;
  char *local_58;
  size_t local_50;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_48;
  char *local_40;
  Builder local_38;
  Builder b;
  
  _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((module->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
  sVar2 = *(size_t *)
           _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  local_40 = *(char **)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
  this_00 = &module->allocator;
  local_98 = this;
  local_90 = module;
  local_80 = sVar2;
  local_38.wasm = module;
  local_88 = (Expression *)MixedArena::allocSpace(this_00,0x40,8);
  local_88->_id = BlockId;
  (local_88->type).id = 0;
  *(undefined8 *)(local_88 + 1) = 0;
  local_88[1].type.id = 0;
  *(undefined8 *)(local_88 + 2) = 0;
  local_88[2].type.id = 0;
  *(undefined8 *)(local_88 + 3) = 0;
  local_88[3].type.id = (uintptr_t)this_00;
  local_48 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(local_88 + 2);
  pEVar3 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
  pEVar3->_id = LocalGetId;
  *(undefined4 *)(pEVar3 + 1) = 0;
  (pEVar3->type).id = 2;
  pEVar4 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
  pEVar4->_id = LocalGetId;
  *(undefined4 *)(pEVar4 + 1) = 2;
  (pEVar4->type).id = 2;
  pBVar5 = (Binary *)MixedArena::allocSpace(this_00,0x28,8);
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar5->op = AddInt32;
  pBVar5->left = pEVar3;
  pBVar5->right = pEVar4;
  Binary::finalize(pBVar5);
  uVar11 = 2;
  memoryName.super_IString.str._M_str = local_40;
  memoryName.super_IString.str._M_len = sVar2;
  pMVar6 = Builder::makeMemorySize(&local_38,memoryName,Unspecified);
  pCVar7 = Builder::makeConst<unsigned_int>(&local_38,0x10000);
  this_01 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = MulInt32;
  this_01->left = (Expression *)pMVar6;
  this_01->right = (Expression *)pCVar7;
  Binary::finalize(this_01);
  this_02 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_02->op = GtUInt32;
  this_02->left = (Expression *)pBVar5;
  this_02->right = (Expression *)this_01;
  Binary::finalize(this_02);
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
  pEVar3->_id = UnreachableId;
  (pEVar3->type).id = 1;
  uVar12 = 0x28;
  this_03 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_03->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_03->condition = (Expression *)this_02;
  this_03->ifTrue = pEVar3;
  this_03->ifFalse = (Expression *)0x0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
  If::finalize(this_03,type_);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (local_48,(Expression *)this_03);
  local_78 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xde8d48),(bool)uVar11);
  local_68 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xdefc81),(bool)uVar11);
  sVar13 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xde8d48),(bool)uVar11);
  local_58 = sVar13._M_str;
  local_50 = sVar13._M_len;
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(undefined4 *)(pEVar3 + 1) = 2;
  (pEVar3->type).id = 2;
  this_04 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  (this_04->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_04->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_04->op = EqZInt32;
  this_04->value = pEVar3;
  Unary::finalize(this_04);
  pBVar8 = (Break *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  (pBVar8->name).super_IString.str._M_len = local_50;
  (pBVar8->name).super_IString.str._M_str = local_58;
  pBVar8->value = (Expression *)0x0;
  pBVar8->condition = (Expression *)this_04;
  Break::finalize(pBVar8);
  local_b8 = pBVar8;
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(undefined4 *)(pEVar3 + 1) = 2;
  (pEVar3->type).id = 2;
  pCVar7 = Builder::makeConst<int>(&local_38,1);
  pBVar5 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar5->op = SubInt32;
  pBVar5->left = pEVar3;
  pBVar5->right = (Expression *)pCVar7;
  Binary::finalize(pBVar5);
  local_b0 = Builder::makeLocalSet(&local_38,2,(Expression *)pBVar5);
  uVar11 = SUB81(&local_b8,0);
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(undefined4 *)(pEVar3 + 1) = 0;
  (pEVar3->type).id = 2;
  pEVar4 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar4->_id = LocalGetId;
  *(undefined4 *)(pEVar4 + 1) = 2;
  (pEVar4->type).id = 2;
  pBVar5 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar5->op = AddInt32;
  pBVar5->left = pEVar3;
  pBVar5->right = pEVar4;
  Binary::finalize(pBVar5);
  pEVar3 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(undefined4 *)(pEVar3 + 1) = 1;
  (pEVar3->type).id = 2;
  this_05 = (Store *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x58,8);
  *(undefined8 *)&(this_05->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression = 0
  ;
  (this_05->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
  *(undefined8 *)&this_05->bytes = 0;
  (this_05->offset).addr = 0;
  (this_05->align).addr = 0;
  *(undefined8 *)&this_05->isAtomic = 0;
  (this_05->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
  this_05->bytes = '\x01';
  (this_05->align).addr = 1;
  this_05->ptr = (Expression *)pBVar5;
  this_05->value = pEVar3;
  (this_05->valueType).id = 2;
  (this_05->memory).super_IString.str._M_len = local_80;
  (this_05->memory).super_IString.str._M_str = local_40;
  Store::finalize(this_05);
  local_a8 = this_05;
  sVar13 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xdefc81),(bool)uVar11);
  pBVar8 = (Break *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  (pBVar8->name).super_IString.str = sVar13;
  pBVar8->value = (Expression *)0x0;
  pBVar8->condition = (Expression *)0x0;
  Break::finalize(pBVar8);
  local_c8._M_array = (iterator)&local_b8;
  local_c8._M_len = 4;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  local_a0 = pBVar8;
  pBVar9 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                     (&local_38,&local_c8,type);
  uVar12 = 0x28;
  this_06 = (Loop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_06->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression._id = LoopId;
  (this_06->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id = 0;
  (this_06->name).super_IString.str._M_len = local_68._M_len;
  (this_06->name).super_IString.str._M_str = local_68._M_str;
  this_06->body = (Expression *)pBVar9;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
  Loop::finalize(this_06,type__00);
  pBVar9 = Builder::makeBlock(&local_38,(Expression *)this_06);
  (pBVar9->name).super_IString.str._M_len = local_78._M_len;
  (pBVar9->name).super_IString.str._M_str = local_78._M_str;
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)this_06;
  Block::finalize(pBVar9,type__01,Unknown);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (local_48,(Expression *)pBVar9);
  pFVar10 = Module::getFunction(local_90,(Name)(local_98->memFillFuncName).super_IString.str);
  pFVar10->body = local_88;
  return;
}

Assistant:

void createMemoryFillFunc(Module* module) {
    Builder b(*module);
    Index dst = 0, val = 1, size = 2;
    Name memory = module->memories.front()->name;
    Block* body = b.makeBlock();

    // if dst + size > memsize in bytes, then trap.
    body->list.push_back(
      b.makeIf(b.makeBinary(BinaryOp::GtUInt32,
                            b.makeBinary(BinaryOp::AddInt32,
                                         b.makeLocalGet(dst, Type::i32),
                                         b.makeLocalGet(size, Type::i32)),
                            b.makeBinary(BinaryOp::MulInt32,
                                         b.makeMemorySize(memory),
                                         b.makeConst(Memory::kPageSize))),
               b.makeUnreachable()));

    body->list.push_back(b.makeBlock(
      "out",
      b.makeLoop(
        "copy",
        b.makeBlock(
          {// break if size == 0
           b.makeBreak(
             "out",
             nullptr,
             b.makeUnary(UnaryOp::EqZInt32, b.makeLocalGet(size, Type::i32))),
           // size--
           b.makeLocalSet(size,
                          b.makeBinary(BinaryOp::SubInt32,
                                       b.makeLocalGet(size, Type::i32),
                                       b.makeConst(1))),
           // *(dst+size) = val
           b.makeStore(1,
                       0,
                       1,
                       b.makeBinary(BinaryOp::AddInt32,
                                    b.makeLocalGet(dst, Type::i32),
                                    b.makeLocalGet(size, Type::i32)),
                       b.makeLocalGet(val, Type::i32),
                       Type::i32,
                       memory),
           b.makeBreak("copy", nullptr)}))));
    module->getFunction(memFillFuncName)->body = body;
  }